

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  buffered_context<char> *ctx;
  bool bVar1;
  char *pcVar2;
  basic_format_arg<fmt::v11::context> arg;
  dynamic_format_specs<char> local_98;
  basic_format_arg<fmt::v11::context> local_68;
  arg_formatter<char> local_48;
  
  ctx = &this->ctx;
  get_arg<fmt::v11::context,int>(&local_68,(detail *)ctx,(context *)(ulong)(uint)id,(int)end);
  bVar1 = basic_format_arg<fmt::v11::context>::format_custom(&local_68,begin,&this->parse_ctx,ctx);
  if (bVar1) {
    pcVar2 = (this->parse_ctx).fmt_.data_;
  }
  else {
    local_98.precision_ref.name.size_ = 0;
    local_98.width_ref.name.data_ = (char *)0x0;
    local_98.width_ref.name.size_ = 0;
    local_98.super_format_specs.super_basic_specs.data_ = 0x8000;
    local_98.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
    local_98.super_format_specs._9_7_ = 0xffffffff000000;
    local_98.super_format_specs._5_4_ = 0;
    local_98.precision_ref.name.data_ = (char *)0x0;
    pcVar2 = parse_format_specs<char>(begin,end,&local_98,&this->parse_ctx,local_68.type_);
    if ((local_98.super_format_specs.super_basic_specs.data_ & 0x3c0) != 0) {
      handle_dynamic_spec<fmt::v11::context>
                (local_98.super_format_specs.super_basic_specs.data_ >> 6 & (name|index),
                 &local_98.super_format_specs.width,&local_98.width_ref,ctx);
      handle_dynamic_spec<fmt::v11::context>
                (local_98.super_format_specs.super_basic_specs.data_ >> 8 & (name|index),
                 &local_98.super_format_specs.precision,&local_98.precision_ref,ctx);
    }
    local_48.out.container = (this->ctx).out_.container;
    local_48.locale.locale_ = (this->ctx).loc_.locale_;
    local_48.specs = &local_98.super_format_specs;
    basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::arg_formatter<char>>
              (&local_68,&local_48);
  }
  return pcVar2;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }